

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_iejoin.cpp
# Opt level: O2

SourceResultType __thiscall
duckdb::PhysicalIEJoin::GetData
          (PhysicalIEJoin *this,ExecutionContext *context,DataChunk *result,
          OperatorSourceInput *input)

{
  SelectionVector *result_00;
  DataChunk *this_00;
  IEJoinGlobalSourceState *this_01;
  IEJoinLocalSourceState *lstate;
  pointer pGVar1;
  const_reference pvVar2;
  idx_t left_cols;
  idx_t iVar3;
  reference pvVar4;
  pointer pGVar5;
  reference pvVar6;
  size_type col_idx;
  idx_t __n;
  size_type __n_00;
  ClientContext *client;
  uint local_a4;
  BufferHandle local_60;
  BufferHandle local_48;
  
  client = (ClientContext *)context;
  pGVar1 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>::
           operator->(&(this->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.
                       super_PhysicalJoin.super_CachingPhysicalOperator.super_PhysicalOperator.
                       sink_state);
  this_01 = (IEJoinGlobalSourceState *)input->global_state;
  lstate = (IEJoinLocalSourceState *)input->local_state;
  IEJoinGlobalSourceState::Initialize(this_01);
  if ((((lstate->joiner).
        super_unique_ptr<duckdb::IEJoinUnion,_std::default_delete<duckdb::IEJoinUnion>_>._M_t.
        super___uniq_ptr_impl<duckdb::IEJoinUnion,_std::default_delete<duckdb::IEJoinUnion>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::IEJoinUnion_*,_std::default_delete<duckdb::IEJoinUnion>_>.
        super__Head_base<0UL,_duckdb::IEJoinUnion_*,_false>._M_head_impl == (IEJoinUnion *)0x0) &&
      (lstate->left_matches == (bool *)0x0)) && (lstate->right_matches == (bool *)0x0)) {
    client = context->client;
    IEJoinGlobalSourceState::GetNextPair(this_01,client,lstate);
  }
  while ((lstate->joiner).
         super_unique_ptr<duckdb::IEJoinUnion,_std::default_delete<duckdb::IEJoinUnion>_>._M_t.
         super___uniq_ptr_impl<duckdb::IEJoinUnion,_std::default_delete<duckdb::IEJoinUnion>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::IEJoinUnion_*,_std::default_delete<duckdb::IEJoinUnion>_>.
         super__Head_base<0UL,_duckdb::IEJoinUnion_*,_false>._M_head_impl != (IEJoinUnion *)0x0) {
    ResolveComplexJoin(this,(ExecutionContext *)client,result,(LocalSourceState *)lstate);
    if (result->count != 0) {
      return HAVE_MORE_OUTPUT;
    }
    client = context->client;
    IEJoinGlobalSourceState::PairCompleted(this_01,client,lstate);
  }
  pvVar2 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::get<true>
                     (&(this->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.
                       super_PhysicalJoin.super_CachingPhysicalOperator.super_PhysicalOperator.
                       children,0);
  left_cols = ((long)(pvVar2->_M_data->types).
                     super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
              (long)(pvVar2->_M_data->types).
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_start) / 0x18;
  this_00 = &lstate->unprojected;
  result_00 = &lstate->true_sel;
  local_a4 = (uint)result_00;
  while (lstate->left_matches != (bool *)0x0) {
    iVar3 = IEJoinLocalSourceState::SelectOuterRows(lstate,lstate->left_matches);
    if (iVar3 == 0) {
      IEJoinGlobalSourceState::GetNextPair(this_01,context->client,lstate);
    }
    else {
      DataChunk::Reset(this_00);
      pvVar4 = vector<duckdb::unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>,_true>
               ::get<true>((vector<duckdb::unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>,_true>
                            *)(pGVar1 + 1),0);
      pGVar5 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
               ::operator->(pvVar4);
      PhysicalRangeJoin::SliceSortedPayload
                (&local_48,this_00,&pGVar5->global_sort_state,lstate->left_block_index,result_00,
                 iVar3,0);
      BufferHandle::~BufferHandle(&local_48);
      for (__n = left_cols;
          __n < (ulong)(((long)(lstate->unprojected).data.
                               super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                               super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(lstate->unprojected).data.
                              super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                              _M_impl.super__Vector_impl_data._M_start) / 0x68); __n = __n + 1) {
        pvVar6 = vector<duckdb::Vector,_true>::get<true>(&this_00->data,__n);
        Vector::SetVectorType(pvVar6,CONSTANT_VECTOR);
        pvVar6 = vector<duckdb::Vector,_true>::get<true>(&this_00->data,__n);
        ConstantVector::SetNull(pvVar6,true);
      }
      PhysicalRangeJoin::ProjectResult(&this->super_PhysicalRangeJoin,this_00,result);
      result->count = iVar3;
      DataChunk::Verify(result);
      local_a4 = (uint)(result->count == 0);
    }
    if (iVar3 != 0) {
      return (SourceResultType)local_a4;
    }
  }
  while( true ) {
    if (lstate->right_matches == (bool *)0x0) goto LAB_019dd629;
    iVar3 = IEJoinLocalSourceState::SelectOuterRows(lstate,lstate->right_matches);
    if (iVar3 != 0) break;
    IEJoinGlobalSourceState::GetNextPair(this_01,context->client,lstate);
  }
  DataChunk::Reset(this_00);
  pvVar4 = vector<duckdb::unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>,_true>
           ::get<true>((vector<duckdb::unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>,_true>
                        *)(pGVar1 + 1),1);
  pGVar5 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
           ::operator->(pvVar4);
  PhysicalRangeJoin::SliceSortedPayload
            (&local_60,this_00,&pGVar5->global_sort_state,lstate->right_block_index,result_00,iVar3,
             left_cols);
  BufferHandle::~BufferHandle(&local_60);
  for (__n_00 = 0; left_cols != __n_00; __n_00 = __n_00 + 1) {
    pvVar6 = vector<duckdb::Vector,_true>::get<true>(&this_00->data,__n_00);
    Vector::SetVectorType(pvVar6,CONSTANT_VECTOR);
    pvVar6 = vector<duckdb::Vector,_true>::get<true>(&this_00->data,__n_00);
    ConstantVector::SetNull(pvVar6,true);
  }
  PhysicalRangeJoin::ProjectResult(&this->super_PhysicalRangeJoin,this_00,result);
  result->count = iVar3;
  DataChunk::Verify(result);
LAB_019dd629:
  return result->count == 0;
}

Assistant:

SourceResultType PhysicalIEJoin::GetData(ExecutionContext &context, DataChunk &result,
                                         OperatorSourceInput &input) const {
	auto &ie_sink = sink_state->Cast<IEJoinGlobalState>();
	auto &ie_gstate = input.global_state.Cast<IEJoinGlobalSourceState>();
	auto &ie_lstate = input.local_state.Cast<IEJoinLocalSourceState>();

	ie_gstate.Initialize();

	if (!ie_lstate.joiner && !ie_lstate.left_matches && !ie_lstate.right_matches) {
		ie_gstate.GetNextPair(context.client, ie_lstate);
	}

	// Process INNER results
	while (ie_lstate.joiner) {
		ResolveComplexJoin(context, result, ie_lstate);

		if (result.size()) {
			return SourceResultType::HAVE_MORE_OUTPUT;
		}

		ie_gstate.PairCompleted(context.client, ie_lstate);
	}

	// Process LEFT OUTER results
	const auto left_cols = children[0].get().GetTypes().size();
	while (ie_lstate.left_matches) {
		const idx_t count = ie_lstate.SelectOuterRows(ie_lstate.left_matches);
		if (!count) {
			ie_gstate.GetNextPair(context.client, ie_lstate);
			continue;
		}
		auto &chunk = ie_lstate.unprojected;
		chunk.Reset();
		SliceSortedPayload(chunk, ie_sink.tables[0]->global_sort_state, ie_lstate.left_block_index, ie_lstate.true_sel,
		                   count);

		// Fill in NULLs to the right
		for (auto col_idx = left_cols; col_idx < chunk.ColumnCount(); ++col_idx) {
			chunk.data[col_idx].SetVectorType(VectorType::CONSTANT_VECTOR);
			ConstantVector::SetNull(chunk.data[col_idx], true);
		}

		ProjectResult(chunk, result);
		result.SetCardinality(count);
		result.Verify();

		return result.size() == 0 ? SourceResultType::FINISHED : SourceResultType::HAVE_MORE_OUTPUT;
	}

	// Process RIGHT OUTER results
	while (ie_lstate.right_matches) {
		const idx_t count = ie_lstate.SelectOuterRows(ie_lstate.right_matches);
		if (!count) {
			ie_gstate.GetNextPair(context.client, ie_lstate);
			continue;
		}

		auto &chunk = ie_lstate.unprojected;
		chunk.Reset();
		SliceSortedPayload(chunk, ie_sink.tables[1]->global_sort_state, ie_lstate.right_block_index, ie_lstate.true_sel,
		                   count, left_cols);

		// Fill in NULLs to the left
		for (idx_t col_idx = 0; col_idx < left_cols; ++col_idx) {
			chunk.data[col_idx].SetVectorType(VectorType::CONSTANT_VECTOR);
			ConstantVector::SetNull(chunk.data[col_idx], true);
		}

		ProjectResult(chunk, result);
		result.SetCardinality(count);
		result.Verify();

		break;
	}

	return result.size() == 0 ? SourceResultType::FINISHED : SourceResultType::HAVE_MORE_OUTPUT;
}